

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_digit.c
# Opt level: O1

int get_digit_sequence_score(NJDNode *start,NJDNode *end)

{
  NJDNode *pNVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  uint uVar7;
  
  if (start->prev == (NJDNode *)0x0) {
    uVar6 = 0;
    goto LAB_00171357;
  }
  pcVar3 = NJDNode_get_pos_group1(start->prev);
  pcVar4 = NJDNode_get_pos_group2(start->prev);
  pcVar5 = NJDNode_get_string(start->prev);
  iVar2 = strcmp(pcVar3,anon_var_dwarf_133d89);
  uVar6 = (uint)(iVar2 == 0) * 2;
  iVar2 = strcmp(pcVar4,anon_var_dwarf_13392a);
  if ((iVar2 == 0) || (iVar2 = strcmp(pcVar3,anon_var_dwarf_133941), iVar2 == 0)) {
    uVar6 = uVar6 | 1;
  }
  uVar7 = uVar6;
  if (pcVar5 != (char *)0x0) {
    iVar2 = is_period(pcVar5);
    if (iVar2 == 0) {
      iVar2 = strcmp(pcVar5,anon_var_dwarf_133d93);
      if ((((iVar2 != 0) && (iVar2 = strcmp(pcVar5,anon_var_dwarf_12e464), iVar2 != 0)) &&
          (iVar2 = strcmp(pcVar5,anon_var_dwarf_133da7), iVar2 != 0)) &&
         ((iVar2 = strcmp(pcVar5,anon_var_dwarf_133db1), iVar2 != 0 &&
          (iVar2 = strcmp(pcVar5,anon_var_dwarf_133dbb), iVar2 != 0)))) {
        iVar2 = strcmp(pcVar5,anon_var_dwarf_12e400);
        if (iVar2 == 0) {
          pNVar1 = start->prev->prev;
          if (pNVar1 == (NJDNode *)0x0) goto LAB_0017132c;
          pcVar5 = NJDNode_get_pos_group1(pNVar1);
          pcVar3 = anon_var_dwarf_1354be + 9;
        }
        else {
          iVar2 = strcmp(pcVar5,anon_var_dwarf_12e414);
          if (iVar2 == 0) goto LAB_00171329;
          pcVar3 = anon_var_dwarf_133dd9;
        }
        iVar2 = strcmp(pcVar5,pcVar3);
        uVar7 = uVar6 - 2;
        goto LAB_0017127a;
      }
LAB_00171329:
      uVar7 = uVar6 - 2;
    }
    else {
      pNVar1 = start->prev->prev;
      if (pNVar1 != (NJDNode *)0x0) {
        pcVar3 = NJDNode_get_pos_group1(pNVar1);
        iVar2 = strcmp(pcVar3,anon_var_dwarf_1354be + 9);
        uVar7 = uVar6 - 5;
LAB_0017127a:
        if (iVar2 != 0) {
          uVar7 = uVar6;
        }
      }
    }
  }
LAB_0017132c:
  pNVar1 = start->prev->prev;
  uVar6 = uVar7;
  if (pNVar1 != (NJDNode *)0x0) {
    pcVar3 = NJDNode_get_string(pNVar1);
    iVar2 = strcmp(pcVar3,anon_var_dwarf_133dd9);
    uVar6 = uVar7 - 2;
    if (iVar2 != 0) {
      uVar6 = uVar7;
    }
  }
LAB_00171357:
  if (end->next != (NJDNode *)0x0) {
    pcVar3 = NJDNode_get_pos_group1(end->next);
    pcVar4 = NJDNode_get_pos_group2(end->next);
    pcVar5 = NJDNode_get_string(end->next);
    iVar2 = strcmp(pcVar4,anon_var_dwarf_13392a);
    if ((iVar2 == 0) || (iVar2 = strcmp(pcVar3,anon_var_dwarf_133941), iVar2 == 0)) {
      uVar6 = uVar6 + 2;
    }
    if (pcVar5 != (char *)0x0) {
      iVar2 = strcmp(pcVar5,anon_var_dwarf_133d93);
      if (((((iVar2 != 0) && (iVar2 = strcmp(pcVar5,anon_var_dwarf_12e464), iVar2 != 0)) &&
           (iVar2 = strcmp(pcVar5,anon_var_dwarf_133da7), iVar2 != 0)) &&
          ((iVar2 = strcmp(pcVar5,anon_var_dwarf_133db1), iVar2 != 0 &&
           (iVar2 = strcmp(pcVar5,anon_var_dwarf_133dbb), iVar2 != 0)))) &&
         (iVar2 = strcmp(pcVar5,anon_var_dwarf_12e400), iVar2 != 0)) {
        iVar2 = strcmp(pcVar5,anon_var_dwarf_12e414);
        if (iVar2 == 0) {
          pNVar1 = end->next->next;
          if (pNVar1 == (NJDNode *)0x0) {
            return uVar6;
          }
          pcVar3 = NJDNode_get_pos_group1(pNVar1);
          iVar2 = strcmp(pcVar3,anon_var_dwarf_1354be + 9);
          if (iVar2 == 0) {
            return uVar6 - 2;
          }
          return uVar6;
        }
        iVar2 = strcmp(pcVar5,anon_var_dwarf_133dd9);
        if (iVar2 != 0) {
          iVar2 = is_period(pcVar5);
          if (iVar2 != 0) {
            return uVar6 + 4;
          }
          return uVar6;
        }
      }
      uVar6 = uVar6 - 2;
    }
  }
  return uVar6;
}

Assistant:

static int get_digit_sequence_score(NJDNode * start, NJDNode * end)
{
   const char *buff_pos_group1 = NULL;
   const char *buff_pos_group2 = NULL;
   const char *buff_string = NULL;
   int score = 0;

   if (start->prev) {
      buff_pos_group1 = NJDNode_get_pos_group1(start->prev);
      buff_pos_group2 = NJDNode_get_pos_group2(start->prev);
      buff_string = NJDNode_get_string(start->prev);
      if (strcmp(buff_pos_group1, NJD_SET_DIGIT_SUUSETSUZOKU) == 0)     /* prev pos_group1 */
         score += 2;
      if (strcmp(buff_pos_group2, NJD_SET_DIGIT_JOSUUSHI) == 0 || strcmp(buff_pos_group1, NJD_SET_DIGIT_FUKUSHIKANOU) == 0)     /* prev pos_group1 and pos_group2 */
         score += 1;
      if (buff_string != NULL) {
         if (is_period(buff_string) == 1) {
            if (!start->prev->prev
                || strcmp(NJDNode_get_pos_group1(start->prev->prev), NJD_SET_DIGIT_KAZU) != 0)
               score += 0;
            else
               score -= 5;
         } else if (strcmp(buff_string, NJD_SET_DIGIT_HAIHUN1) == 0)
            score -= 2;
         else if (strcmp(buff_string, NJD_SET_DIGIT_HAIHUN2) == 0)
            score -= 2;
         else if (strcmp(buff_string, NJD_SET_DIGIT_HAIHUN3) == 0)
            score -= 2;
         else if (strcmp(buff_string, NJD_SET_DIGIT_HAIHUN4) == 0)
            score -= 2;
         else if (strcmp(buff_string, NJD_SET_DIGIT_HAIHUN5) == 0)
            score -= 2;
         else if (strcmp(buff_string, NJD_SET_DIGIT_KAKKO1) == 0) {
            if (!start->prev->prev
                || strcmp(NJDNode_get_pos_group1(start->prev->prev), NJD_SET_DIGIT_KAZU) != 0)
               score += 0;
            else
               score -= 2;
         } else if (strcmp(buff_string, NJD_SET_DIGIT_KAKKO2) == 0)
            score -= 2;
         else if (strcmp(buff_string, NJD_SET_DIGIT_BANGOU) == 0)
            score -= 2;
      }
      if (start->prev->prev) {
         buff_string = NJDNode_get_string(start->prev->prev);   /* prev prev string */
         if (strcmp(buff_string, NJD_SET_DIGIT_BANGOU) == 0)
            score -= 2;
      }
   }
   if (end->next) {
      buff_pos_group1 = NJDNode_get_pos_group1(end->next);
      buff_pos_group2 = NJDNode_get_pos_group2(end->next);      /* next pos_group2 */
      buff_string = NJDNode_get_string(end->next);      /* next string */
      if (strcmp(buff_pos_group2, NJD_SET_DIGIT_JOSUUSHI) == 0
          || strcmp(buff_pos_group1, NJD_SET_DIGIT_FUKUSHIKANOU) == 0)
         score += 2;
      if (buff_string != NULL) {
         if (strcmp(buff_string, NJD_SET_DIGIT_HAIHUN1) == 0)
            score -= 2;
         else if (strcmp(buff_string, NJD_SET_DIGIT_HAIHUN2) == 0)
            score -= 2;
         else if (strcmp(buff_string, NJD_SET_DIGIT_HAIHUN3) == 0)
            score -= 2;
         else if (strcmp(buff_string, NJD_SET_DIGIT_HAIHUN4) == 0)
            score -= 2;
         else if (strcmp(buff_string, NJD_SET_DIGIT_HAIHUN5) == 0)
            score -= 2;
         else if (strcmp(buff_string, NJD_SET_DIGIT_KAKKO1) == 0)
            score -= 2;
         else if (strcmp(buff_string, NJD_SET_DIGIT_KAKKO2) == 0) {
            if (!end->next->next
                || strcmp(NJDNode_get_pos_group1(end->next->next), NJD_SET_DIGIT_KAZU) != 0)
               score += 0;
            else
               score -= 2;
         } else if (strcmp(buff_string, NJD_SET_DIGIT_BANGOU) == 0)
            score -= 2;
         else if (is_period(buff_string) == 1)
            score += 4;
      }
   }

   return score;
}